

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StructCmpxchg * __thiscall MixedArena::alloc<wasm::StructCmpxchg>(MixedArena *this)

{
  StructCmpxchg *pSVar1;
  
  pSVar1 = (StructCmpxchg *)allocSpace(this,0x38,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression._id =
       StructCmpxchgId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id = 0;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }